

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_widgets.cpp
# Opt level: O2

float __thiscall
ImGuiMenuColumns::DeclColumns
          (ImGuiMenuColumns *this,float w_icon,float w_label,float w_shortcut,float w_mark)

{
  ulong uVar1;
  uint uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  
  auVar3._0_4_ = (int)w_icon;
  auVar3._4_4_ = (int)w_label;
  auVar3._8_4_ = (int)w_shortcut;
  auVar3._12_4_ = (int)w_mark;
  auVar3 = pshuflw(auVar3,auVar3,0xe8);
  auVar3 = pshufhw(auVar3,auVar3,0xe8);
  auVar4._0_4_ = auVar3._0_4_;
  auVar4._8_4_ = auVar3._8_4_;
  auVar4._12_4_ = auVar3._12_4_;
  auVar4._4_4_ = auVar4._8_4_;
  uVar1 = *(ulong *)this->Widths;
  auVar5._8_8_ = 0;
  auVar5._0_8_ = uVar1;
  auVar3 = psubusw(auVar4,auVar5);
  *(ulong *)this->Widths =
       CONCAT26(auVar3._6_2_ + (short)(uVar1 >> 0x30),
                CONCAT24(auVar3._4_2_ + (short)(uVar1 >> 0x20),
                         CONCAT22(auVar3._2_2_ + (short)(uVar1 >> 0x10),auVar3._0_2_ + (short)uVar1)
                        ));
  CalcNextTotalWidth(this,false);
  uVar2 = this->NextTotalWidth;
  if (this->NextTotalWidth < this->TotalWidth) {
    uVar2 = this->TotalWidth;
  }
  return (float)uVar2;
}

Assistant:

float ImGuiMenuColumns::DeclColumns(float w_icon, float w_label, float w_shortcut, float w_mark)
{
    Widths[0] = ImMax(Widths[0], (ImU16)w_icon);
    Widths[1] = ImMax(Widths[1], (ImU16)w_label);
    Widths[2] = ImMax(Widths[2], (ImU16)w_shortcut);
    Widths[3] = ImMax(Widths[3], (ImU16)w_mark);
    CalcNextTotalWidth(false);
    return (float)ImMax(TotalWidth, NextTotalWidth);
}